

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O1

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Unit>::mapping(IO *IO,Unit *Unit)

{
  EmptyContext local_1e;
  EmptyContext local_1d;
  EmptyContext local_1c;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [3];
  EmptyContext Ctx_5;
  EmptyContext Ctx_4;
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
            (IO,"Length",&Unit->Length,true,local_19);
  yaml::IO::processKey<unsigned_short,llvm::yaml::EmptyContext>
            (IO,"Version",&Unit->Version,true,&local_1a);
  if (4 < Unit->Version) {
    yaml::IO::processKey<llvm::dwarf::UnitType,llvm::yaml::EmptyContext>
              (IO,"UnitType",&Unit->Type,true,&local_1b);
  }
  yaml::IO::processKey<unsigned_int,llvm::yaml::EmptyContext>
            (IO,"AbbrOffset",&Unit->AbbrOffset,true,&local_1c);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"AddrSize",&Unit->AddrSize,true,&local_1d);
  yaml::IO::
  mapOptionalWithContext<std::vector<llvm::DWARFYAML::Entry,std::allocator<llvm::DWARFYAML::Entry>>,llvm::yaml::EmptyContext>
            (IO,"Entries",&Unit->Entries,&local_1e);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Unit>::mapping(IO &IO, DWARFYAML::Unit &Unit) {
  IO.mapRequired("Length", Unit.Length);
  IO.mapRequired("Version", Unit.Version);
  if (Unit.Version >= 5)
    IO.mapRequired("UnitType", Unit.Type);
  IO.mapRequired("AbbrOffset", Unit.AbbrOffset);
  IO.mapRequired("AddrSize", Unit.AddrSize);
  IO.mapOptional("Entries", Unit.Entries);
}